

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O3

uchar __thiscall
EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  
  bVar3 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
          EnvNAVXYTHETALATCfg.Grid2D[X][Y];
  if (0 < (long)this->numofadditionalzlevs) {
    lVar2 = 0;
    do {
      bVar1 = this->AddLevelGrid2D[lVar2][X][Y];
      if (this->AddLevelGrid2D[lVar2][X][Y] < bVar3) {
        bVar1 = bVar3;
      }
      bVar3 = bVar1;
      lVar2 = lVar2 + 1;
    } while (this->numofadditionalzlevs != lVar2);
    return bVar3;
  }
  return bVar3;
}

Assistant:

unsigned char EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(int X, int Y)
{
    unsigned char mapcost = EnvNAVXYTHETALATCfg.Grid2D[X][Y];

    for (int levind = 0; levind < numofadditionalzlevs; levind++) {
        mapcost = __max(mapcost, AddLevelGrid2D[levind][X][Y]);
    }

    return mapcost;
}